

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  underlying_type_t<Color> uVar2;
  enable_if_t<Color,_underlying_type_t<Color>_> eVar3;
  enable_if_t<Color,_std::decay_t<Color>_> value;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  const_iterator pvVar5;
  ostream *poVar6;
  Color *pCVar7;
  enable_if_t<Color,_std::size_t> eVar8;
  const_iterator pvVar9;
  const_iterator pvVar10;
  enable_if_t<Color,_string_view> __str_00;
  value_type *e;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  array<std::pair<Color,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL> *__range1_2;
  array<std::pair<Color,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL> entries;
  Flags flag;
  value_type c;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<Color,_3UL> *__range1_1;
  array<Color,_3UL> values;
  _Optional_payload_base<Color> _Stack_d4;
  enable_if_t<Color,_underlying_type_t<Color>_> c4_integer;
  enable_if_t<Color,_optional<std::decay_t<Color>_>_> c3;
  undefined8 local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  _Optional_payload_base<Color> local_98;
  enable_if_t<Color,_optional<std::decay_t<Color>_>,_std::equal_to<void>_> c2;
  value_type *n;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *__range1;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> names;
  char *local_20;
  enable_if_t<Color,_string_view> c1_name;
  Color c1;
  
  __str_00 = magic_enum::enum_name<Color,(magic_enum::detail::enum_subtype)0>(RED);
  local_20 = (char *)__str_00._M_len;
  names._M_elems[2]._M_str = local_20;
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,__str_00);
  std::ostream::operator<<((ostream *)pbVar4,std::endl<char,std::char_traits<char>>);
  memcpy(&__range1,&DAT_00105c80,0x30);
  std::operator<<((ostream *)&std::cout,"Color names:");
  __end1 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::begin
                     ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&__range1
                     );
  pvVar5 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::end
                     ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&__range1
                     );
  for (; __end1 != pvVar5; __end1 = __end1 + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout," ");
    c2.super__Optional_base<Color,_true,_true>._M_payload.super__Optional_payload_base<Color> =
         (_Optional_base<Color,_true,_true>)__end1->_M_len;
    __str._M_len = __end1->_M_len;
    __str._M_str = __end1->_M_str;
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar6,__str);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"BLUE");
  local_98 = (_Optional_payload_base<Color>)
             magic_enum::enum_cast<Color,(magic_enum::detail::enum_subtype)0,std::equal_to<void>>
                       (local_a8._M_len,local_a8._M_str);
  bVar1 = std::optional<Color>::has_value((optional<Color> *)&local_98);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"BLUE = ");
    pCVar7 = std::optional<Color>::value((optional<Color> *)&local_98);
    uVar2 = to_integer<Color>(*pCVar7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &c3.super__Optional_base<Color,_true,_true>._M_payload.
              super__Optional_payload_base<Color>._M_engaged,"blue");
  local_98 = (_Optional_payload_base<Color>)
             magic_enum::
             enum_cast<Color,(magic_enum::detail::enum_subtype)0,magic_enum::detail::case_insensitive<std::equal_to<void>>>
                       (stack0xffffffffffffff38,local_c0);
  bVar1 = std::optional<Color>::has_value((optional<Color> *)&local_98);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"BLUE = ");
    pCVar7 = std::optional<Color>::value((optional<Color> *)&local_98);
    uVar2 = to_integer<Color>(*pCVar7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  _Stack_d4 = (_Optional_payload_base<Color>)
              magic_enum::enum_cast<Color,(magic_enum::detail::enum_subtype)0>(10);
  bVar1 = std::optional<Color>::has_value((optional<Color> *)&stack0xffffffffffffff2c);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"GREEN = ");
    pCVar7 = std::optional<Color>::value((optional<Color> *)&stack0xffffffffffffff2c);
    eVar3 = magic_enum::enum_integer<Color>(*pCVar7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,eVar3);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  eVar3 = magic_enum::enum_integer<Color>(RED);
  poVar6 = std::operator<<((ostream *)&std::cout,"RED = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,eVar3);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Color: ");
  pbVar4 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,RED);
  poVar6 = std::operator<<((ostream *)pbVar4," ");
  pbVar4 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
                      (optional<Color>)local_98);
  poVar6 = std::operator<<((ostream *)pbVar4," ");
  values._M_elems._4_8_ = _Stack_d4;
  pbVar4 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
                      (optional<Color>)_Stack_d4);
  std::ostream::operator<<((ostream *)pbVar4,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Color enum size: ");
  eVar8 = magic_enum::enum_count<Color,(magic_enum::detail::enum_subtype)0>();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,eVar8);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Color[0] = ");
  value = magic_enum::enum_value<Color,(magic_enum::detail::enum_subtype)0>(0);
  pbVar4 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,value);
  std::ostream::operator<<((ostream *)pbVar4,std::endl<char,std::char_traits<char>>);
  stack0xffffffffffffff0c = 0xfffffff6;
  values._M_elems[0] = GREEN;
  std::operator<<((ostream *)&std::cout,"Colors values:");
  __end1_1 = std::array<Color,_3UL>::begin((array<Color,_3UL> *)((long)&__range1_1 + 4));
  pvVar9 = std::array<Color,_3UL>::end((array<Color,_3UL> *)((long)&__range1_1 + 4));
  for (; __end1_1 != pvVar9; __end1_1 = __end1_1 + 1) {
    entries._M_elems[2].second._M_str._4_4_ = *__end1_1;
    poVar6 = std::operator<<((ostream *)&std::cout," ");
    magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
              ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
               entries._M_elems[2].second._M_str._4_4_);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  entries._M_elems[2].second._M_str._0_4_ = magic_enum::bitwise_operators::operator|<Flags,_0>(A,C);
  pbVar4 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Flags,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                      (Flags)entries._M_elems[2].second._M_str);
  std::ostream::operator<<((ostream *)pbVar4,std::endl<char,std::char_traits<char>>);
  memcpy(&__range1_2,&DAT_00105cb0,0x48);
  std::operator<<((ostream *)&std::cout,"Colors entries:");
  __end1_2 = std::
             array<std::pair<Color,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL>::
             begin((array<std::pair<Color,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL>
                    *)&__range1_2);
  pvVar10 = std::
            array<std::pair<Color,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL>::
            end((array<std::pair<Color,_std::basic_string_view<char,_std::char_traits<char>_>_>,_3UL>
                 *)&__range1_2);
  for (; __end1_2 != pvVar10; __end1_2 = __end1_2 + 1) {
    poVar6 = std::operator<<((ostream *)&std::cout," ");
    pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar6,__end1_2->second
                            );
    poVar6 = std::operator<<((ostream *)pbVar4," = ");
    std::ostream::operator<<(poVar6,__end1_2->first);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  // Enum variable to string name.
  Color c1 = Color::RED;
  auto c1_name = magic_enum::enum_name(c1);
  std::cout << c1_name << std::endl; // RED

  // String enum name sequence.
  constexpr auto names = magic_enum::enum_names<Color>();
  std::cout << "Color names:";
  for (const auto& n : names) {
    std::cout << " " << n;
  }
  std::cout << std::endl;
  // Color names: RED BLUE GREEN

  // String name to enum value.
  auto c2 = magic_enum::enum_cast<Color>("BLUE");
  if (c2.has_value()) {
    std::cout << "BLUE = " << to_integer(c2.value()) << std::endl; // BLUE = 0
  }

  // Case insensitive enum_cast.
  c2 = magic_enum::enum_cast<Color>("blue", magic_enum::case_insensitive);
  if (c2.has_value()) {
    std::cout << "BLUE = " << to_integer(c2.value()) << std::endl; // BLUE = 0
  }

  // Integer value to enum value.
  auto c3 = magic_enum::enum_cast<Color>(10);
  if (c3.has_value()) {
    std::cout << "GREEN = " << magic_enum::enum_integer(c3.value()) << std::endl; // GREEN = 10
  }

  // Enum value to integer value.
  auto c4_integer = magic_enum::enum_integer(Color::RED);
  std::cout << "RED = " << c4_integer << std::endl; // RED = -10

  using magic_enum::iostream_operators::operator<<; // out-of-the-box ostream operator for all enums.
  // Ostream operator for enum.
  std::cout << "Color: " << c1 << " " << c2 << " " << c3 << std::endl; // Color: RED BLUE GREEN

  // Number of enum values.
  std::cout << "Color enum size: " << magic_enum::enum_count<Color>() << std::endl; // Color size: 3

  // Indexed access to enum value.
  std::cout << "Color[0] = " << magic_enum::enum_value<Color>(0) << std::endl; // Color[0] = RED

  // Enum value sequence.
  constexpr auto values = magic_enum::enum_values<Color>();
  std::cout << "Colors values:";
  for (const auto c : values) {
    std::cout << " " << c; // Ostream operator for enum.
  }
  std::cout << std::endl;
  // Color values: RED BLUE GREEN

  enum class Flags { A = 1, B = 2, C = 4, D = 8 };
  using namespace magic_enum::bitwise_operators; // out-of-the-box bitwise operators for all enums.
  // Support operators: ~, |, &, ^, |=, &=, ^=.
  Flags flag = Flags::A | Flags::C;
  std::cout << flag << std::endl; // 5

  enum color { red, green, blue };

  // Checks whether type is an Unscoped enumeration.
  static_assert(magic_enum::is_unscoped_enum_v<color>);
  static_assert(!magic_enum::is_unscoped_enum_v<Color>);
  static_assert(!magic_enum::is_unscoped_enum_v<Flags>);

  // Checks whether type is an Scoped enumeration.
  static_assert(!magic_enum::is_scoped_enum_v<color>);
  static_assert(magic_enum::is_scoped_enum_v<Color>);
  static_assert(magic_enum::is_scoped_enum_v<Flags>);

  // Enum pair (value enum, string enum name) sequence.
  constexpr auto entries = magic_enum::enum_entries<Color>();
  std::cout << "Colors entries:";
  for (const auto& e : entries) {
    std::cout << " "  << e.second << " = " << static_cast<int>(e.first);
  }
  std::cout << std::endl;
  // Color entries: RED = -10 BLUE = 0 GREEN = 10

  return 0;
}